

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileLibraryTargetGenerator::WriteModuleLibraryRules
          (cmMakefileLibraryTargetGenerator *this,bool relink)

{
  string *config;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmTarget *this_00;
  cmLocalUnixMakefileGenerator3 *pcVar3;
  char *pcVar4;
  string linkFlagsConfig;
  string extraFlags;
  string linkRuleVar;
  string linkLanguage;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  config = &(this->super_cmMakefileTargetGenerator).ConfigName;
  cmTarget::GetLinkerLanguage(&local_50,(this->super_cmMakefileTargetGenerator).Target,config);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_","");
  std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&local_70);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  this_00 = (this->super_cmMakefileTargetGenerator).Target;
  pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  paVar1 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"LINK_FLAGS","");
  pcVar4 = cmTarget::GetProperty(this_00,&local_d0);
  (*(pcVar3->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(pcVar3,&local_90,pcVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"LINK_FLAGS_","");
  cmsys::SystemTools::UpperCase(&local_b0,config);
  std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0._M_dataplus._M_p);
  paVar2 = &local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  pcVar4 = cmTarget::GetProperty((this->super_cmMakefileTargetGenerator).Target,&local_d0);
  (*(pcVar3->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(pcVar3,&local_90,pcVar4);
  pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"CMAKE_MODULE_LINKER_FLAGS","");
  cmLocalGenerator::AddConfigVariableFlags
            (&pcVar3->super_cmLocalGenerator,&local_90,&local_b0,config);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  cmMakefileTargetGenerator::AddModuleDefinitionFlag
            (&this->super_cmMakefileTargetGenerator,&local_90);
  WriteLibraryRules(this,&local_70,&local_90,relink);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteModuleLibraryRules(bool relink)
{
  std::string linkLanguage =
    this->Target->GetLinkerLanguage(this->ConfigName);
  std::string linkRuleVar = "CMAKE_";
  linkRuleVar += linkLanguage;
  linkRuleVar += "_CREATE_SHARED_MODULE";

  std::string extraFlags;
  this->LocalGenerator->AppendFlags(extraFlags,
                                    this->Target->GetProperty("LINK_FLAGS"));
  std::string linkFlagsConfig = "LINK_FLAGS_";
  linkFlagsConfig += cmSystemTools::UpperCase(this->ConfigName);
  this->LocalGenerator->AppendFlags
    (extraFlags, this->Target->GetProperty(linkFlagsConfig));
  this->LocalGenerator->AddConfigVariableFlags
    (extraFlags, "CMAKE_MODULE_LINKER_FLAGS", this->ConfigName);
  this->AddModuleDefinitionFlag(extraFlags);

  this->WriteLibraryRules(linkRuleVar, extraFlags, relink);
}